

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O1

double units::puconversion::assumedBase(unit *start,unit *result)

{
  bool bVar1;
  double dVar2;
  unit local_28;
  unit local_20;
  
  bVar1 = unit::operator==((unit *)&puHz,result);
  dVar2 = 60.0;
  if (!bVar1) {
    bVar1 = unit::operator==((unit *)&puHz,start);
    dVar2 = 60.0;
    if (!bVar1) {
      bVar1 = unit::operator==((unit *)&puMW,result);
      dVar2 = 100.0;
      if (!bVar1) {
        bVar1 = unit::operator==((unit *)&puMW,start);
        dVar2 = 100.0;
        if (!bVar1) {
          local_20.multiplier_ = 1.0;
          local_20.base_units_ = (unit_data)0x100000f1;
          bVar1 = unit::operator==(&local_20,result);
          if (!bVar1) {
            local_28.multiplier_ = 1.0;
            local_28.base_units_ = (unit_data)0x100000f1;
            bVar1 = unit::operator==(&local_28,start);
            if (!bVar1) {
              return NAN;
            }
          }
          dVar2 = 341.25;
        }
      }
    }
  }
  return dVar2;
}

Assistant:

inline double assumedBase(const unit& start, const unit& result)
    {
        if (puHz == result || puHz == start) {  // assume 60 Hz
            return 60.0;
        }
        if (puMW == result || puMW == start) {  // assume 100MVA for power base
            return 100.0;
        }
        // mach number
        if (unit_cast(precise::special::mach) == result ||
            unit_cast(precise::special::mach) ==
                start) {  // assume NASA mach number approximation conversions
            return 341.25;
        }
        return constants::invalid_conversion;
    }